

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_recv_creq(udp_ep *ep,udp_sp_creq *creq,nng_sockaddr *sa)

{
  int iVar1;
  nni_time nVar2;
  nni_time now;
  udp_pipe *p;
  nng_sockaddr *sa_local;
  udp_sp_creq *creq_local;
  udp_ep *ep_local;
  
  p = (udp_pipe *)sa;
  sa_local = (nng_sockaddr *)creq;
  creq_local = (udp_sp_creq *)ep;
  nVar2 = nni_clock();
  if ((creq_local[0x32].us_ver & 1) == 0) {
    now = (nni_time)
          udp_find_pipe((udp_ep *)creq_local,*(uint32_t *)((sa_local->s_ipc).sa_path + 6),
                        (sa_local->s_in).sa_addr);
    if ((udp_pipe *)now == (udp_pipe *)0x0) {
      if (((creq_local[2].us_sequence & 1) == 0) && ((creq_local[2].us_sequence & 0x10000) == 0)) {
        if ((sa_local->s_ipc).sa_path[0x11] == '\0') {
          udp_send_disc_full((udp_ep *)creq_local,(nng_sockaddr *)p,0,(sa_local->s_in).sa_addr,0,
                             DISC_NEGO);
        }
        else {
          iVar1 = nni_pipe_alloc_listener
                            ((void **)&now,*(nni_listener **)&creq_local[0x32].us_peer_id);
          if (iVar1 == 0) {
            iVar1 = udp_pipe_start((udp_pipe *)now,(udp_ep *)creq_local,(nng_sockaddr *)p);
            if (iVar1 == 0) {
              if ((int)((uint)(sa_local->s_in6).sa_addr[0xf] * 1000) < *(int *)(now + 0xb4)) {
                *(uint *)(now + 0xb4) = (uint)(sa_local->s_in6).sa_addr[0xf] * 1000;
              }
              *(uint16_t *)(now + 0x98) = (sa_local->s_in6).sa_port;
              *(uint32_t *)(now + 0xa0) = (sa_local->s_in).sa_addr;
              *(int *)(now + 0xa8) = *(int *)((sa_local->s_ipc).sa_path + 10) + 1;
              *(undefined2 *)(now + 0xac) = *(undefined2 *)((sa_local->s_ipc).sa_path + 0xe);
              *(nni_time *)(now + 0xb8) = nVar2 + (long)*(int *)(now + 0xb4);
              udp_pipe_schedule((udp_pipe *)now);
              nni_list_append((nni_list *)&creq_local[0x80].us_peer_id,(void *)now);
              udp_send_cack((udp_ep *)creq_local,(udp_pipe *)now);
              udp_ep_match((udp_ep *)creq_local);
            }
            else {
              udp_send_disc_full((udp_ep *)creq_local,(nng_sockaddr *)p,0,(sa_local->s_in).sa_addr,0
                                 ,DISC_NOBUF);
              nni_pipe_close(*(nni_pipe **)(now + 8));
            }
          }
          else {
            udp_send_disc_full((udp_ep *)creq_local,(nng_sockaddr *)p,0,(sa_local->s_in).sa_addr,0,
                               DISC_NOBUF);
          }
        }
      }
      else {
        udp_send_disc_full((udp_ep *)creq_local,(nng_sockaddr *)p,0,(sa_local->s_in).sa_addr,0,
                           DISC_REFUSED);
      }
    }
    else if ((((udp_pipe *)now)->peer_id != 0) &&
            (((udp_pipe *)now)->peer == (sa_local->s_in6).sa_port)) {
      if ((sa_local->s_ipc).sa_path[0x11] == '\0') {
        udp_send_disc((udp_ep *)creq_local,(udp_pipe *)now,DISC_NEGO);
      }
      else {
        if ((int)((uint)(sa_local->s_in6).sa_addr[0xf] * 1000) < ((udp_pipe *)now)->refresh) {
          ((udp_pipe *)now)->refresh = (uint)(sa_local->s_in6).sa_addr[0xf] * 1000;
        }
        ((udp_pipe *)now)->next_wake = nVar2 + (long)((udp_pipe *)now)->refresh;
        ((udp_pipe *)now)->expire = nVar2 + (long)(((udp_pipe *)now)->refresh * 5);
        udp_pipe_schedule((udp_pipe *)now);
        udp_send_cack((udp_ep *)creq_local,(udp_pipe *)now);
      }
    }
  }
  else {
    udp_send_disc_full((udp_ep *)creq_local,(nng_sockaddr *)p,
                       *(uint32_t *)((sa_local->s_ipc).sa_path + 6),(sa_local->s_in).sa_addr,0,
                       DISC_REFUSED);
  }
  return;
}

Assistant:

static void
udp_recv_creq(udp_ep *ep, udp_sp_creq *creq, nng_sockaddr *sa)
{
	udp_pipe *p;
	nni_time  now;

	now = nni_clock();
	if (ep->dialer) {
		// dialers do not accept CREQ requests
		udp_send_disc_full(ep, sa, creq->us_peer_id,
		    creq->us_sender_id, 0, DISC_REFUSED);
		return;
	}
	if ((p = udp_find_pipe(ep, creq->us_peer_id, creq->us_sender_id))) {
		if ((p->peer_id == 0) || (p->peer != creq->us_type)) {
			// we don't expect this -- a connection request from a
			// peer while we have an oustanding request of our own.
			// We *could* compare the sockaddrs to see if they
			// match and if so then treat this as just a dueling
			// connection. but for now we just discard it -- we'll
			// wait for the CACK.
			return;
		}

		// so we know who it is from.. this is a refresh.
		if (creq->us_refresh == 0) {
			udp_send_disc(ep, p, DISC_NEGO);
			return;
		}
		if ((creq->us_refresh * NNI_SECOND) < p->refresh) {
			p->refresh = creq->us_refresh * NNI_SECOND;
		}
		p->next_wake = now + UDP_PIPE_REFRESH(p);
		p->expire    = now + UDP_PIPE_TIMEOUT(p);

		udp_pipe_schedule(p);
		udp_send_cack(ep, p);
		return;
	}

	// new pipe
	if (ep->fini || ep->closed) {
		// endpoint is closing down, reject it.
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_REFUSED);
		return;
	}
	if (creq->us_refresh == 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NEGO);
		return;
	}

	if (nni_pipe_alloc_listener((void **) &p, ep->nlistener) != 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NOBUF);
		return;
	}
	if (udp_pipe_start(p, ep, sa) != 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NOBUF);
		nni_pipe_close(p->npipe);
		return;
	}

	if ((creq->us_refresh * NNI_SECOND) < p->refresh) {
		p->refresh = (creq->us_refresh * NNI_SECOND);
	}
	p->peer      = creq->us_type;
	p->peer_id   = creq->us_sender_id;
	p->peer_seq  = creq->us_sequence + 1;
	p->sndmax    = creq->us_recv_max;
	p->next_wake = now + UDP_PIPE_REFRESH(p);

	udp_pipe_schedule(p);
	nni_list_append(&ep->connpipes, p);
	udp_send_cack(ep, p);
	udp_ep_match(ep);
}